

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_BucketCount_Test<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_BucketCount_Test
          (HashtableAllTest_BucketCount_Test<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::~HashtableTest((HashtableTest<google::HashtableInterface_DenseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                    *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketCount) {
  TypeParam ht(100);
  // constructor arg is number of *items* to be inserted, not the
  // number of buckets, so we expect more buckets.
  EXPECT_GT(ht.bucket_count(), 100u);
  for (int i = 1; i < 200; i++) {
    ht.insert(this->UniqueObject(i));
  }
  EXPECT_GT(ht.bucket_count(), 200u);
}